

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O0

bool __thiscall
IRT::MemFromConstPlusRegPattern::TryToGenerateCode
          (MemFromConstPlusRegPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  ConstMemPtr pCVar1;
  AssemblyCommands *this_00;
  ChildrenTemps *pCVar2;
  CExpression *pCVar3;
  CTemp *__args_2;
  CTempExpression *local_150;
  ConstTempPtr local_140;
  CBinopExpression *local_130;
  ConstBinopPtr local_120;
  undefined1 local_108 [16];
  CExpression *local_f8;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_f0;
  pair<IRT::CTemp,_const_IRT::INode_*> local_c8;
  undefined1 local_a0 [8];
  CTemp source;
  undefined1 local_68 [24];
  ConstTempPtr constTempPtr;
  ConstConstPtr constPtr;
  ConstBinopPtr constBinopPtr;
  ConstMemPtr memPtr;
  AssemblyCommands *commands_local;
  ChildrenTemps *children_local;
  CTemp *dest_local;
  INode *tree_local;
  MemFromConstPlusRegPattern *this_local;
  
  memPtr = (ConstMemPtr)commands;
  commands_local = (AssemblyCommands *)children;
  children_local = (ChildrenTemps *)dest;
  dest_local = (CTemp *)tree;
  tree_local = (INode *)this;
  if (tree == (INode *)0x0) {
    local_120 = (ConstBinopPtr)0x0;
  }
  else {
    local_120 = (ConstBinopPtr)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
  }
  constBinopPtr = local_120;
  if (local_120 != (ConstBinopPtr)0x0) {
    pCVar3 = CMemExpression::getAddress((CMemExpression *)local_120);
    if (pCVar3 == (CExpression *)0x0) {
      local_130 = (CBinopExpression *)0x0;
    }
    else {
      local_130 = (CBinopExpression *)
                  __dynamic_cast(pCVar3,&CExpression::typeinfo,&CBinopExpression::typeinfo,0);
    }
    constPtr = (ConstConstPtr)local_130;
    if (local_130 != (CBinopExpression *)0x0) {
      pCVar3 = CBinopExpression::getLeftOperand(local_130);
      if (pCVar3 == (CExpression *)0x0) {
        local_140 = (ConstTempPtr)0x0;
      }
      else {
        local_140 = (ConstTempPtr)
                    __dynamic_cast(pCVar3,&CExpression::typeinfo,&CConstExpression::typeinfo,0);
      }
      constTempPtr = local_140;
      if (local_140 != (ConstTempPtr)0x0) {
        pCVar3 = CBinopExpression::getRightOperand((CBinopExpression *)constPtr);
        if (pCVar3 == (CExpression *)0x0) {
          local_150 = (CTempExpression *)0x0;
        }
        else {
          local_150 = (CTempExpression *)
                      __dynamic_cast(pCVar3,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
        }
        pCVar2 = children_local;
        pCVar1 = memPtr;
        local_68._16_8_ = local_150;
        if (local_150 == (CTempExpression *)0x0) {
          CTemp::CTemp((CTemp *)local_a0);
          this_00 = commands_local;
          local_f8 = CMemExpression::getAddress((CMemExpression *)constBinopPtr);
          std::make_pair<IRT::CTemp&,IRT::CExpression_const*>(&local_f0,(CTemp *)local_a0,&local_f8)
          ;
          std::pair<IRT::CTemp,_const_IRT::INode_*>::
          pair<IRT::CTemp,_const_IRT::CExpression_*,_true>(&local_c8,&local_f0);
          std::
          vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
          ::push_back((vector<std::pair<IRT::CTemp,_const_IRT::INode_*>,_std::allocator<std::pair<IRT::CTemp,_const_IRT::INode_*>_>_>
                       *)this_00,&local_c8);
          std::pair<IRT::CTemp,_const_IRT::INode_*>::~pair(&local_c8);
          std::pair<IRT::CTemp,_const_IRT::CExpression_*>::~pair(&local_f0);
          pCVar2 = children_local;
          pCVar1 = memPtr;
          CConstExpression::getValue((CConstExpression *)constTempPtr);
          std::
          make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg,IRT::CTemp_const&,IRT::CTemp&,int>
                    ((CTemp *)local_108,(CTemp *)pCVar2,(int *)local_a0);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)pCVar1,(shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)local_108);
          std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>::~shared_ptr
                    ((shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)local_108);
          CTemp::~CTemp((CTemp *)local_a0);
        }
        else {
          __args_2 = CTempExpression::getTemprorary(local_150);
          CConstExpression::getValue((CConstExpression *)constTempPtr);
          std::
          make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg,IRT::CTemp_const&,IRT::CTemp_const&,int>
                    ((CTemp *)local_68,(CTemp *)pCVar2,(int *)__args_2);
          std::
          vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
          ::emplace_back<std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>>
                    ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                      *)pCVar1,(shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)local_68);
          std::shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg>::~shared_ptr
                    ((shared_ptr<AssemblyCode::MoveMemFromRegPlusConstToReg> *)local_68);
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IRT::MemFromConstPlusRegPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest,
                                                         ChildrenTemps &children, AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstBinopPtr constBinopPtr = dynamic_cast<ConstBinopPtr>(memPtr->getAddress( ));
        if ( constBinopPtr ) {
            ConstConstPtr constPtr = dynamic_cast<ConstConstPtr>(constBinopPtr->getLeftOperand( ));
            if ( constPtr ) {
                ConstTempPtr constTempPtr = dynamic_cast<ConstTempPtr>(constBinopPtr->getRightOperand( ));
                if ( constTempPtr ) {
                    commands.emplace_back(
                            std::make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg>( dest,
                                                                                          constTempPtr->getTemprorary( ),
                                                                                          constPtr->getValue( )));
                } else {
                    CTemp source;
                    children.push_back( std::make_pair( source, memPtr->getAddress( )));
                    commands.emplace_back(
                            std::make_shared<AssemblyCode::MoveMemFromRegPlusConstToReg>( dest, source,
                                                                                          constPtr->getValue( )));
                }
                return true;
            }
        }
    }
    return false;
}